

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEmbeddedFileDocumentHelper.cc
# Opt level: O3

void __thiscall
QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper
          (QPDFEmbeddedFileDocumentHelper *this,QPDF *qpdf)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  QPDFNameTreeObjectHelper *pQVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  Members *__p;
  QPDFObjectHandle embedded_files;
  QPDFObjectHandle names;
  QPDFObjectHandle root;
  undefined1 local_79;
  QPDFNameTreeObjectHelper *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  undefined1 local_68 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  QPDF local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  (this->super_QPDFDocumentHelper).qpdf = qpdf;
  (this->super_QPDFDocumentHelper)._vptr_QPDFDocumentHelper =
       (_func_int **)&PTR__QPDFEmbeddedFileDocumentHelper_002ec578;
  __p = (Members *)operator_new(0x10);
  (__p->embedded_files).super___shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__p->embedded_files).super___shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m).super___shared_ptr<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<QPDFEmbeddedFileDocumentHelper::Members*>
            (&(this->m).
              super___shared_ptr<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,__p);
  QPDF::getRoot(&local_30);
  local_78 = (QPDFNameTreeObjectHelper *)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"/Names","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_68 + 0x28),(string *)&local_30);
  if (local_78 != (QPDFNameTreeObjectHelper *)local_68) {
    operator_delete(local_78,local_68._0_8_ + 1);
  }
  bVar4 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)(local_68 + 0x28));
  if (bVar4) {
    local_78 = (QPDFNameTreeObjectHelper *)local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"/EmbeddedFiles","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_68 + 0x18),(string *)(local_68 + 0x28));
    if (local_78 != (QPDFNameTreeObjectHelper *)local_68) {
      operator_delete(local_78,local_68._0_8_ + 1);
    }
    bVar4 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)(local_68 + 0x18));
    if (bVar4) {
      local_78 = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<QPDFNameTreeObjectHelper,std::allocator<QPDFNameTreeObjectHelper>,QPDFObjectHandle&,QPDF&>
                (&_Stack_70,&local_78,(allocator<QPDFNameTreeObjectHelper> *)&local_79,
                 (QPDFObjectHandle *)(local_68 + 0x18),qpdf);
      _Var3._M_pi = _Stack_70._M_pi;
      pQVar2 = local_78;
      peVar1 = (this->m).
               super___shared_ptr<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_78 = (QPDFNameTreeObjectHelper *)0x0;
      _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (peVar1->embedded_files).
                super___shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi;
      (peVar1->embedded_files).
      super___shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pQVar2;
      (peVar1->embedded_files).
      super___shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var3._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._32_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._32_8_);
    }
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper(QPDF& qpdf) :
    QPDFDocumentHelper(qpdf),
    m(new Members())
{
    auto root = qpdf.getRoot();
    auto names = root.getKey("/Names");
    if (names.isDictionary()) {
        auto embedded_files = names.getKey("/EmbeddedFiles");
        if (embedded_files.isDictionary()) {
            m->embedded_files = std::make_shared<QPDFNameTreeObjectHelper>(embedded_files, qpdf);
        }
    }
}